

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O3

string * __thiscall
OutputRedirect::restore_and_read_abi_cxx11_(string *__return_storage_ptr__,OutputRedirect *this)

{
  ssize_t sVar1;
  size_t in_RCX;
  int __fd;
  char buffer [4096];
  undefined1 auStack_1028 [4096];
  
  restore(this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->read_end_).fd_ != -1) {
    do {
      sVar1 = fmt::v5::file::read(&this->read_end_,(int)auStack_1028,(void *)0x1000,in_RCX);
      __fd = (int)auStack_1028;
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)auStack_1028);
    } while (sVar1 != 0);
    fmt::v5::file::close(&this->read_end_,__fd);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OutputRedirect::restore_and_read() {
  // Restore output.
  restore();

  // Read everything from the pipe.
  std::string content;
  if (read_end_.descriptor() == -1)
    return content;  // Already read.
  enum { BUFFER_SIZE = 4096 };
  char buffer[BUFFER_SIZE];
  std::size_t count = 0;
  do {
    count = read_end_.read(buffer, BUFFER_SIZE);
    content.append(buffer, count);
  } while (count != 0);
  read_end_.close();
  return content;
}